

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_folding_rules.cpp
# Opt level: O0

BinaryScalarFoldingRule *
spvtools::opt::anon_unknown_0::
FoldBinaryIntegerOperation<(spvtools::opt::(anonymous_namespace)::Sign)0>
          (BinaryScalarFoldingRule *__return_storage_ptr__,_func_uint64_t_uint64_t_uint64_t *op)

{
  anon_class_8_1_3fcf669f local_20;
  _func_uint64_t_uint64_t_uint64_t *local_18;
  _func_uint64_t_uint64_t_uint64_t *op_local;
  
  local_20.op = op;
  local_18 = op;
  op_local = (_func_uint64_t_uint64_t_uint64_t *)__return_storage_ptr__;
  std::
  function<spvtools::opt::analysis::Constant_const*(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*)>
  ::
  function<spvtools::opt::(anonymous_namespace)::FoldBinaryIntegerOperation<(spvtools::opt::(anonymous_namespace)::Sign)0>(unsigned_long(*)(unsigned_long,unsigned_long))::_lambda(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*)_1_,void>
            ((function<spvtools::opt::analysis::Constant_const*(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*)>
              *)__return_storage_ptr__,&local_20);
  return __return_storage_ptr__;
}

Assistant:

BinaryScalarFoldingRule FoldBinaryIntegerOperation(uint64_t (*op)(uint64_t,
                                                                  uint64_t)) {
  return
      [op](const analysis::Type* result_type, const analysis::Constant* a,
           const analysis::Constant* b,
           analysis::ConstantManager* const_mgr) -> const analysis::Constant* {
        assert(result_type != nullptr && a != nullptr && b != nullptr);
        const analysis::Integer* integer_type = result_type->AsInteger();
        assert(integer_type != nullptr);
        assert(a->type()->kind() == analysis::Type::kInteger);
        assert(b->type()->kind() == analysis::Type::kInteger);
        assert(integer_type->width() == a->type()->AsInteger()->width());
        assert(integer_type->width() == b->type()->AsInteger()->width());

        // In SPIR-V, all operations support unsigned types, but the way they
        // are interpreted depends on the opcode. This is why we use the
        // template argument to determine how to interpret the operands.
        uint64_t ia = (signedness == Signed ? a->GetSignExtendedValue()
                                            : a->GetZeroExtendedValue());
        uint64_t ib = (signedness == Signed ? b->GetSignExtendedValue()
                                            : b->GetZeroExtendedValue());
        uint64_t result = op(ia, ib);

        const analysis::Constant* result_constant =
            const_mgr->GenerateIntegerConstant(integer_type, result);
        return result_constant;
      };
}